

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

bool __thiscall ON_Xform::Orthogonalize(ON_Xform *this,double tol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  ON_Xform *pOVar11;
  ON_3dVector *pOVar12;
  ON_Xform *pOVar13;
  ulong uVar14;
  byte bVar15;
  ON_3dVector T;
  ON_Xform LTL;
  ON_Xform L;
  ON_3dVector local_1e0;
  ON_3dVector local_1c8;
  double local_1b0;
  double dStack_1a8;
  double local_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  ON_3dVector local_148;
  ON_Xform local_130;
  ON_Xform local_b0;
  
  bVar15 = 0;
  bVar7 = IsAffine(this);
  if (bVar7) {
    ON_Xform(&local_b0);
    DecomposeAffine(this,&local_148,&local_b0);
    pOVar11 = &local_b0;
    pOVar13 = &local_130;
    for (lVar9 = 0x10; dVar6 = local_130.m_xform[2][3], dVar5 = local_130.m_xform[1][3],
        dVar4 = local_130.m_xform[1][2], dVar3 = local_130.m_xform[0][3],
        dVar2 = local_130.m_xform[0][2], dVar1 = local_130.m_xform[0][1], lVar9 != 0;
        lVar9 = lVar9 + -1) {
      pOVar13->m_xform[0][0] = pOVar11->m_xform[0][0];
      pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar15 * -2 + 1) * 8);
      pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar15 * -2 + 1) * 8);
    }
    local_130.m_xform[0][1] = local_130.m_xform[1][0];
    local_130.m_xform[1][0] = dVar1;
    local_130.m_xform[0][2] = local_130.m_xform[2][0];
    local_130.m_xform[2][0] = dVar2;
    local_130.m_xform[0][3] = local_130.m_xform[3][0];
    local_130.m_xform[3][0] = dVar3;
    local_130.m_xform[1][2] = local_130.m_xform[2][1];
    local_130.m_xform[2][1] = dVar4;
    local_130.m_xform[1][3] = local_130.m_xform[3][1];
    local_130.m_xform[3][1] = dVar5;
    local_130.m_xform[2][3] = local_130.m_xform[3][2];
    local_130.m_xform[3][2] = dVar6;
    operator*((ON_Xform *)&local_1c8,&local_130,&local_b0);
    pOVar12 = &local_1c8;
    pOVar11 = &local_130;
    for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
      pOVar11->m_xform[0][0] = pOVar12->x;
      pOVar12 = (ON_3dVector *)((long)pOVar12 + (ulong)bVar15 * -0x10 + 8);
      pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar15 * -2 + 1) * 8);
    }
    bVar8 = IsIdentity(&local_130,tol);
    bVar7 = true;
    if (!bVar8) {
      ON_3dVector::ON_3dVector(&local_1c8,(double *)this);
      ON_3dVector::ON_3dVector(&local_1e0,this->m_xform[1]);
      local_1a0 = local_1e0.z;
      local_1b0 = local_1e0.x;
      dStack_1a8 = local_1e0.y;
      ON_3dVector::ON_3dVector(&local_1e0,this->m_xform[2]);
      local_188 = local_1e0.z;
      local_198 = local_1e0.x;
      dStack_190 = local_1e0.y;
      uVar10 = 0;
      do {
        if (uVar10 != 0) {
          uVar14 = uVar10;
          pOVar12 = &local_1c8;
          do {
            dVar1 = ON_3dVector::operator*(&local_1c8 + uVar10,pOVar12);
            ::operator*(&local_1e0,dVar1,pOVar12);
            ON_3dVector::operator-=(&local_1c8 + uVar10,&local_1e0);
            pOVar12 = pOVar12 + 1;
            uVar14 = uVar14 - 1;
          } while (uVar14 != 0);
        }
        bVar7 = ON_3dVector::Unitize(&local_1c8 + uVar10);
      } while ((bVar7) && (bVar8 = uVar10 < 2, uVar10 = uVar10 + 1, bVar8));
      if (bVar7) {
        this->m_xform[0][2] = local_1c8.z;
        this->m_xform[0][0] = local_1c8.x;
        this->m_xform[0][1] = local_1c8.y;
        this->m_xform[1][2] = local_1a0;
        this->m_xform[1][0] = local_1b0;
        this->m_xform[1][1] = dStack_1a8;
        this->m_xform[2][2] = local_188;
        this->m_xform[2][0] = local_198;
        this->m_xform[2][1] = dStack_190;
      }
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool ON_Xform::Orthogonalize(double tol)
{
	bool rc = false;
	if (IsAffine())
	{
		ON_3dVector T;
		ON_Xform L;
		DecomposeAffine(T, L);
		ON_Xform LTL = L;
		LTL.Transpose();
		LTL = LTL * L;
		if (!LTL.IsIdentity(tol))
		{
			// Gram - Schmidt
			ON_3dVector V[3];
			V[0] = ON_3dVector(m_xform[0]);
			V[1] = ON_3dVector(m_xform[1]);
			V[2] = ON_3dVector(m_xform[2]);
			rc = true;
			for (int i = 0; rc && i < 3; i++)
			{
				for (int j = 0; j < i; j++)
					V[i] -= V[i] * V[j] * V[j];
				rc = V[i].Unitize();
			}
			if (rc)
			{
				*(reinterpret_cast<ON_3dVector*>(m_xform[0])) = V[0];
				*(reinterpret_cast<ON_3dVector*>(m_xform[1])) = V[1];
				*(reinterpret_cast<ON_3dVector*>(m_xform[2])) = V[2];
			}
		}
		else
			rc = true;
	}
	return rc;
}